

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tree.h
# Opt level: O0

node_type * __thiscall Tree<NULLC::Range>::left_rotate(Tree<NULLC::Range> *this,node_type *x)

{
  node_type *pnVar1;
  node<NULLC::Range> *pnVar2;
  int iVar3;
  int iVar4;
  node_type *T2;
  node_type *y;
  node_type *x_local;
  Tree<NULLC::Range> *this_local;
  
  pnVar1 = x->right;
  pnVar2 = pnVar1->left;
  pnVar1->left = x;
  x->right = pnVar2;
  iVar3 = get_height(this,x->left);
  iVar4 = get_height(this,x->right);
  iVar3 = detail::max<int>(iVar3,iVar4);
  x->height = iVar3 + 1;
  iVar3 = get_height(this,pnVar1->left);
  iVar4 = get_height(this,pnVar1->right);
  iVar3 = detail::max<int>(iVar3,iVar4);
  pnVar1->height = iVar3 + 1;
  return pnVar1;
}

Assistant:

node_type* left_rotate(node_type* x)
	{
		node_type *y = x->right;
		node_type *T2 = y->left;

		y->left = x;
		x->right = T2;

		x->height = detail::max(get_height(x->left), get_height(x->right)) + 1;
		y->height = detail::max(get_height(y->left), get_height(y->right)) + 1;

		return y;
	}